

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O2

void __thiscall
t_rs_generator::render_enum_impl(t_rs_generator *this,t_enum *tenum,string *enum_name)

{
  int *piVar1;
  t_enum_value *ptVar2;
  ostream *poVar3;
  pointer pptVar4;
  ofstream_with_content_based_conditional_update *poVar5;
  vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> constants;
  string local_90;
  string *local_70;
  _Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_> local_68;
  string local_50;
  
  poVar5 = &this->f_gen_;
  poVar3 = std::operator<<((ostream *)poVar5,"impl ");
  local_70 = enum_name;
  poVar3 = std::operator<<(poVar3,(string *)enum_name);
  poVar3 = std::operator<<(poVar3," {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  std::vector<t_enum_value_*,_std::allocator<t_enum_value_*>_>::vector
            ((vector<t_enum_value_*,_std::allocator<t_enum_value_*>_> *)&local_68,&tenum->constants_
            );
  for (pptVar4 = local_68._M_impl.super__Vector_impl_data._M_start;
      pptVar4 != local_68._M_impl.super__Vector_impl_data._M_finish; pptVar4 = pptVar4 + 1) {
    ptVar2 = *pptVar4;
    render_rustdoc(this,&ptVar2->super_t_doc);
    t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
    poVar3 = std::operator<<((ostream *)poVar5,(string *)&local_90);
    poVar3 = std::operator<<(poVar3,"pub const ");
    rust_enum_variant_name(&local_50,this,&ptVar2->name_);
    poVar3 = std::operator<<(poVar3,(string *)&local_50);
    poVar3 = std::operator<<(poVar3,": ");
    poVar3 = std::operator<<(poVar3,(string *)local_70);
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = std::operator<<(poVar3,(string *)local_70);
    poVar3 = std::operator<<(poVar3,"(");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,ptVar2->value_);
    poVar3 = std::operator<<(poVar3,")");
    poVar3 = std::operator<<(poVar3,";");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
  }
  t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)poVar5,(string *)&local_90);
  poVar3 = std::operator<<(poVar3,"pub const ENUM_VALUES: &\'static [Self] = &[");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_90);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  for (pptVar4 = local_68._M_impl.super__Vector_impl_data._M_start;
      pptVar4 != local_68._M_impl.super__Vector_impl_data._M_finish; pptVar4 = pptVar4 + 1) {
    ptVar2 = *pptVar4;
    t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
    poVar3 = std::operator<<((ostream *)poVar5,(string *)&local_90);
    poVar3 = std::operator<<(poVar3,"Self::");
    rust_enum_variant_name(&local_50,this,&ptVar2->name_);
    poVar3 = std::operator<<(poVar3,(string *)&local_50);
    poVar3 = std::operator<<(poVar3,",");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
  }
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)poVar5,(string *)&local_90);
  poVar3 = std::operator<<(poVar3,"];");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_90);
  t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)poVar5,(string *)&local_90);
  poVar3 = std::operator<<(poVar3,"#[allow(clippy::trivially_copy_pass_by_ref)]");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_90);
  t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)poVar5,(string *)&local_90);
  poVar3 = std::operator<<(poVar3,
                           "pub fn write_to_out_protocol(&self, o_prot: &mut dyn TOutputProtocol) -> thrift::Result<()> {"
                          );
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_90);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)poVar5,(string *)&local_90);
  poVar3 = std::operator<<(poVar3,"o_prot.write_i32(self.0)");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_90);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)poVar5,(string *)&local_90);
  poVar3 = std::operator<<(poVar3,"}");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_90);
  t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)poVar5,(string *)&local_90);
  poVar3 = std::operator<<(poVar3,
                           "pub fn read_from_in_protocol(i_prot: &mut dyn TInputProtocol) -> thrift::Result<"
                          );
  poVar3 = std::operator<<(poVar3,(string *)local_70);
  poVar3 = std::operator<<(poVar3,"> {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_90);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)poVar5,(string *)&local_90);
  poVar3 = std::operator<<(poVar3,"let enum_value = i_prot.read_i32()?;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_90);
  t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)poVar5,(string *)&local_90);
  poVar3 = std::operator<<(poVar3,"Ok(");
  poVar3 = std::operator<<(poVar3,(string *)local_70);
  poVar3 = std::operator<<(poVar3,"::from(enum_value)");
  poVar3 = std::operator<<(poVar3,")");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_90);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)poVar5,(string *)&local_90);
  poVar3 = std::operator<<(poVar3,"}");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_90);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  poVar3 = std::operator<<((ostream *)poVar5,"}");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<((ostream *)poVar5,(string *)&::endl_abi_cxx11_);
  std::_Vector_base<t_enum_value_*,_std::allocator<t_enum_value_*>_>::~_Vector_base(&local_68);
  return;
}

Assistant:

void t_rs_generator::render_enum_impl(t_enum* tenum, const string& enum_name) {
  f_gen_ << "impl " << enum_name << " {" << endl;
  indent_up();

  vector<t_enum_value*> constants = tenum->get_constants();

  // associated constants for each IDL-defined enum variant
  {
      vector<t_enum_value*>::iterator constants_iter;
      for (constants_iter = constants.begin(); constants_iter != constants.end(); ++constants_iter) {
        t_enum_value* val = (*constants_iter);
        render_rustdoc((t_doc*) val);
        f_gen_
            << indent()
            << "pub const " << rust_enum_variant_name(val->get_name()) << ": " << enum_name
            << " = "
            << enum_name << "(" << val->get_value() << ")"
            << ";"
            << endl;
      }
  }

  // array containing all IDL-defined enum variants
  {
    f_gen_ << indent() << "pub const ENUM_VALUES: &'static [Self] = &[" << endl;
    indent_up();
    vector<t_enum_value*>::iterator constants_iter;
    for (constants_iter = constants.begin(); constants_iter != constants.end(); ++constants_iter) {
      t_enum_value* val = (*constants_iter);
      f_gen_
          << indent()
          << "Self::" << rust_enum_variant_name(val->get_name())
          << ","
          << endl;
    }
    indent_down();
    f_gen_ << indent() << "];" << endl;
  }

  f_gen_ << indent() << "#[allow(clippy::trivially_copy_pass_by_ref)]" << endl;
  f_gen_
    << indent()
    << "pub fn write_to_out_protocol(&self, o_prot: &mut dyn TOutputProtocol) -> thrift::Result<()> {"
    << endl;
  indent_up();
  f_gen_ << indent() << "o_prot.write_i32(self.0)" << endl;
  indent_down();
  f_gen_ << indent() << "}" << endl;

  f_gen_
    << indent()
    << "pub fn read_from_in_protocol(i_prot: &mut dyn TInputProtocol) -> thrift::Result<" << enum_name << "> {"
    << endl;
  indent_up();
  f_gen_ << indent() << "let enum_value = i_prot.read_i32()?;" << endl;
  f_gen_ << indent() << "Ok(" << enum_name << "::from(enum_value)" << ")" << endl;
  indent_down();
  f_gen_ << indent() << "}" << endl;

  indent_down();
  f_gen_ << "}" << endl;
  f_gen_ << endl;
}